

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void gguf_add_tensor(gguf_context *ctx,ggml_tensor *tensor)

{
  bool bVar1;
  int64_t iVar2;
  void *in_RSI;
  gguf_tensor_info ti;
  vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_> *in_stack_fffffffffffffe90;
  value_type *in_stack_fffffffffffffe98;
  vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_> *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_fffffffffffffea8;
  gguf_context *in_stack_fffffffffffffeb0;
  
  if (in_RSI == (void *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",
               0x447,"GGML_ASSERT(%s) failed","tensor");
  }
  iVar2 = gguf_find_tensor(in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
  if (iVar2 == -1) {
    memcpy(&stack0xfffffffffffffe98,in_RSI,0x150);
    bVar1 = std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::empty
                      (in_stack_fffffffffffffea0);
    if (!bVar1) {
      std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::back
                (in_stack_fffffffffffffe90);
      std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::back
                (in_stack_fffffffffffffe90);
      ggml_nbytes(in_stack_fffffffffffffea8);
    }
    std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::push_back
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",0x449
             ,"duplicate tensor name: %s",(long)in_RSI + 0x100);
}

Assistant:

void gguf_add_tensor(
             struct gguf_context * ctx,
        const struct ggml_tensor * tensor) {
    GGML_ASSERT(tensor);
    if (gguf_find_tensor(ctx, tensor->name) != -1) {
        GGML_ABORT("duplicate tensor name: %s", tensor->name);
    }

    struct gguf_tensor_info ti;
    ti.t = *tensor;
    ti.offset = ctx->info.empty() ? 0 :
        ctx->info.back().offset + GGML_PAD(ggml_nbytes(&ctx->info.back().t), ctx->alignment);
    ctx->info.push_back(ti);
}